

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_channel.cpp
# Opt level: O3

bool __thiscall BmsChannel::IsShouldPlayWavChannel(BmsChannel *this)

{
  uint uVar1;
  
  uVar1 = GetChannelType(this);
  return (bool)((byte)(0x2008000000200802 >> ((byte)uVar1 & 0x3f)) & uVar1 < 0x3e);
}

Assistant:

bool
BmsChannel::IsShouldPlayWavChannel(void) const
{
	// 01, 11 -- 1Z, 21 -- 2Z, 51 -- 5Z, 61 -- 6Z

	switch (GetChannelType()) {
	case BmsChannelType::BGM:
	case BmsChannelType::FIRSTPLAYER:
	case BmsChannelType::FIRSTPLAYERLN:
	case BmsChannelType::SECONDPLAYER:
	case BmsChannelType::SECONDPLAYERLN:
		return true;
	default:
		return false;
	}
}